

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::peekNext(QRegularExpressionMatchIterator *this)

{
  long lVar1;
  long *in_RSI;
  
  lVar1 = *(long *)(*in_RSI + 8);
  if ((*(char *)(lVar1 + 0x5e) != '\x01') ||
     ((*(char *)(lVar1 + 0x5c) == '\0' && (*(char *)(lVar1 + 0x5d) == '\0')))) {
    peekNext();
  }
  QRegularExpressionMatch::QRegularExpressionMatch
            ((QRegularExpressionMatch *)this,(QRegularExpressionMatch *)(*in_RSI + 8));
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::peekNext() const
{
    if (!hasNext())
        qWarning("QRegularExpressionMatchIterator::peekNext() called on an iterator already at end");

    return d->next;
}